

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureFilteringTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::TextureCubeArrayFilteringCase::deinit(TextureCubeArrayFilteringCase *this)

{
  TextureCubeArray *pTVar1;
  pointer pFVar2;
  
  pTVar1 = this->m_gradientTex;
  if (pTVar1 != (TextureCubeArray *)0x0) {
    glu::TextureCubeArray::~TextureCubeArray(pTVar1);
    operator_delete(pTVar1,0x68);
  }
  pTVar1 = this->m_gridTex;
  if (pTVar1 != (TextureCubeArray *)0x0) {
    glu::TextureCubeArray::~TextureCubeArray(pTVar1);
    operator_delete(pTVar1,0x68);
  }
  this->m_gradientTex = (TextureCubeArray *)0x0;
  this->m_gridTex = (TextureCubeArray *)0x0;
  deqp::gls::TextureTestUtil::TextureRenderer::clear(&this->m_renderer);
  pFVar2 = (this->m_cases).
           super__Vector_base<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase,_std::allocator<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_cases).
      super__Vector_base<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase,_std::allocator<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>_>
      ._M_impl.super__Vector_impl_data._M_finish != pFVar2) {
    (this->m_cases).
    super__Vector_base<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase,_std::allocator<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>_>
    ._M_impl.super__Vector_impl_data._M_finish = pFVar2;
  }
  return;
}

Assistant:

void TextureCubeArrayFilteringCase::deinit (void)
{
	delete m_gradientTex;
	delete m_gridTex;

	m_gradientTex	= DE_NULL;
	m_gridTex		= DE_NULL;

	m_renderer.clear();
	m_cases.clear();
}